

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O1

string * BamTools::Internal::BamStandardIndex::Extension_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)in_RDI,BAI_EXTENSION_abi_cxx11_._M_dataplus._M_p,
             BAI_EXTENSION_abi_cxx11_._M_dataplus._M_p + BAI_EXTENSION_abi_cxx11_._M_string_length);
  return in_RDI;
}

Assistant:

const std::string BamStandardIndex::Extension()
{
    return BamStandardIndex::BAI_EXTENSION;
}